

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O3

int run_test_fs_event_watch_dir(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  uv_loop_t *puVar2;
  char *pcVar3;
  int iVar4;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar5;
  uv_fs_t *puVar6;
  uv_fs_event_t *puVar7;
  uv_timer_t *puVar8;
  uv_fs_event_t *puVar9;
  uv_fs_t uStack_3d8;
  uv_loop_t *puStack_220;
  code *pcStack_218;
  char *pcStack_210;
  uv_fs_t uStack_1e8;
  uv_loop_t *puStack_28;
  
  puVar2 = uv_default_loop();
  fs_event_unlink_files((uv_timer_t *)0x0);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");
  pcVar3 = (char *)puVar2;
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar7 = &fs_event;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_dir_multi_file,"watch_dir",0);
    pcVar3 = (char *)puVar7;
    if (iVar1 != 0) goto LAB_001567dc;
    pcVar3 = (char *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_001567e1;
    puVar8 = &timer;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,100,0);
    pcVar3 = (char *)puVar8;
    if (iVar1 != 0) goto LAB_001567e6;
    pcVar3 = (char *)puVar2;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (fs_event_cb_called != fs_event_removed + fs_event_created) goto LAB_001567eb;
    if (close_cb_called != 2) goto LAB_001567f0;
    fs_event_unlink_files((uv_timer_t *)0x0);
    remove("watch_dir/file2");
    remove("watch_dir/file1");
    remove("watch_dir/");
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcVar3 = (char *)uv_default_loop();
    iVar1 = uv_loop_close((uv_loop_t *)pcVar3);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_fs_event_watch_dir_cold_1();
LAB_001567dc:
    run_test_fs_event_watch_dir_cold_2();
LAB_001567e1:
    run_test_fs_event_watch_dir_cold_3();
LAB_001567e6:
    run_test_fs_event_watch_dir_cold_4();
LAB_001567eb:
    run_test_fs_event_watch_dir_cold_5();
LAB_001567f0:
    run_test_fs_event_watch_dir_cold_6();
  }
  run_test_fs_event_watch_dir_cold_7();
  puStack_28 = puVar2;
  if ((uv_loop_t *)pcVar3 == (uv_loop_t *)0x0) {
LAB_00156882:
    uVar5 = 0;
    do {
      uStack_1e8.bufsml[3].len = 0x1568b1;
      snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-",(ulong)uVar5);
      uStack_1e8.bufsml[3].len = 0x1568b9;
      iVar1 = remove(fs_event_filename);
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x10);
    return iVar1;
  }
  if (fs_event_removed < 0x10) {
    uStack_1e8.bufsml[3].len = 0x15683b;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    pcVar3 = fs_event_filename;
    uStack_1e8.bufsml[3].len = 0x156843;
    iVar1 = remove(fs_event_filename);
    if (iVar1 == 0) {
      if (0xe < fs_event_removed) {
        iVar1 = fs_event_removed;
        fs_event_removed = fs_event_removed + 1;
        return iVar1;
      }
      uStack_1e8.bufsml[3].len = 0x156879;
      fs_event_removed = fs_event_removed + 1;
      iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
      if (iVar1 == 0) {
        return 0;
      }
      uStack_1e8.bufsml[3].len = 0x156882;
      fs_event_unlink_files_cold_3();
      goto LAB_00156882;
    }
  }
  else {
    uStack_1e8.bufsml[3].len = 0x1568d0;
    fs_event_unlink_files_cold_1();
  }
  uStack_1e8.bufsml[3].len = (size_t)create_dir;
  fs_event_unlink_files_cold_2();
  puVar6 = &uStack_1e8;
  puVar7 = (uv_fs_event_t *)0x0;
  iVar4 = 0x1ed;
  iVar1 = uv_fs_mkdir((uv_loop_t *)0x0,&uStack_1e8,pcVar3,0x1ed,(uv_fs_cb)0x0);
  if ((iVar1 == -0x11) || (iVar1 == 0)) {
    uv_fs_req_cleanup(&uStack_1e8);
    return extraout_EAX;
  }
  create_dir_cold_1();
  uVar5 = fs_event_cb_called + 1;
  pcVar3 = (char *)(ulong)uVar5;
  fs_event_cb_called = uVar5;
  if (puVar7 == &fs_event) {
    if (iVar4 != 0) goto LAB_001569c2;
    if (1 < extraout_EDX - 1U) goto LAB_001569c7;
    iVar1 = strncmp((char *)puVar6,"fsevent-",8);
    if (iVar1 == 0) {
      iVar1 = fs_event_removed + fs_event_created;
      if (iVar1 == 0x10) {
        iVar1 = uv_timer_start(&timer,fs_event_unlink_files,1,0);
        if (iVar1 == 0) {
          return 0;
        }
        fs_event_cb_dir_multi_file_cold_5();
        iVar1 = extraout_EAX_00;
      }
      if (uVar5 != 0x20) {
        return iVar1;
      }
      uv_close((uv_handle_t *)&timer,close_cb);
      uv_close((uv_handle_t *)&fs_event,close_cb);
      return extraout_EAX_01;
    }
  }
  else {
    fs_event_cb_dir_multi_file_cold_1();
LAB_001569c2:
    fs_event_cb_dir_multi_file_cold_2();
LAB_001569c7:
    fs_event_cb_dir_multi_file_cold_3();
  }
  fs_event_cb_dir_multi_file_cold_4();
  if (fs_event_created < 0x10) {
    pcVar3 = fs_event_filename;
    snprintf(fs_event_filename,0x1000,"watch_dir/%s%d","fsevent-");
    create_file(fs_event_filename);
    iVar1 = fs_event_created;
    if (0xe < fs_event_created) {
      fs_event_created = fs_event_created + 1;
      return iVar1;
    }
    fs_event_created = fs_event_created + 1;
    iVar1 = uv_timer_start(&timer,fs_event_create_files,1,0);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    fs_event_create_files_cold_1();
  }
  fs_event_create_files_cold_2();
  pcStack_218 = (code *)0x156a53;
  pcStack_210 = pcVar3;
  puVar2 = uv_default_loop();
  pcStack_218 = (code *)0x156a65;
  remove("watch_dir/file2");
  pcStack_218 = (code *)0x156a74;
  remove("watch_dir/file1");
  pcStack_218 = (code *)0x156a80;
  remove("watch_dir/");
  pcStack_218 = (code *)0x156a8c;
  create_dir("watch_dir");
  pcStack_218 = (code *)0x156a94;
  create_file("watch_dir/file1");
  pcStack_218 = (code *)0x156a9c;
  create_file("watch_dir/file2");
  pcStack_218 = (code *)0x156aab;
  puVar8 = (uv_timer_t *)puVar2;
  iVar1 = uv_fs_event_init(puVar2,&fs_event);
  if (iVar1 == 0) {
    puVar7 = &fs_event;
    pcStack_218 = (code *)0x156acf;
    iVar1 = uv_fs_event_start(&fs_event,fs_event_cb_file,"watch_dir/file2",0);
    puVar8 = (uv_timer_t *)puVar7;
    if (iVar1 != 0) goto LAB_00156bae;
    pcStack_218 = (code *)0x156ae6;
    puVar8 = (uv_timer_t *)puVar2;
    iVar1 = uv_timer_init(puVar2,&timer);
    if (iVar1 != 0) goto LAB_00156bb3;
    puVar8 = &timer;
    pcStack_218 = (code *)0x156b0b;
    iVar1 = uv_timer_start(&timer,timer_cb_file,100,100);
    if (iVar1 != 0) goto LAB_00156bb8;
    pcStack_218 = (code *)0x156b1d;
    puVar8 = (uv_timer_t *)puVar2;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (fs_event_cb_called != 1) goto LAB_00156bbd;
    if (timer_cb_called != 2) goto LAB_00156bc2;
    if (close_cb_called != 2) goto LAB_00156bc7;
    pcStack_218 = (code *)0x156b50;
    remove("watch_dir/file2");
    pcStack_218 = (code *)0x156b5c;
    remove("watch_dir/file1");
    pcStack_218 = (code *)0x156b68;
    remove("watch_dir/");
    pcStack_218 = (code *)0x156b6d;
    puVar2 = uv_default_loop();
    pcStack_218 = (code *)0x156b81;
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    pcStack_218 = (code *)0x156b8b;
    uv_run(puVar2,UV_RUN_DEFAULT);
    pcStack_218 = (code *)0x156b90;
    puVar8 = (uv_timer_t *)uv_default_loop();
    pcStack_218 = (code *)0x156b98;
    iVar1 = uv_loop_close((uv_loop_t *)puVar8);
    if (iVar1 == 0) {
      pcStack_218 = (code *)0x156ba1;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_218 = (code *)0x156bae;
    run_test_fs_event_watch_file_cold_1();
LAB_00156bae:
    pcStack_218 = (code *)0x156bb3;
    run_test_fs_event_watch_file_cold_2();
LAB_00156bb3:
    pcStack_218 = (code *)0x156bb8;
    run_test_fs_event_watch_file_cold_3();
LAB_00156bb8:
    pcStack_218 = (code *)0x156bbd;
    run_test_fs_event_watch_file_cold_4();
LAB_00156bbd:
    pcStack_218 = (code *)0x156bc2;
    run_test_fs_event_watch_file_cold_5();
LAB_00156bc2:
    pcStack_218 = (code *)0x156bc7;
    run_test_fs_event_watch_file_cold_6();
LAB_00156bc7:
    pcStack_218 = (code *)0x156bcc;
    run_test_fs_event_watch_file_cold_7();
  }
  pcStack_218 = create_file;
  run_test_fs_event_watch_file_cold_8();
  pcStack_218 = (code *)0x1a20ce;
  puVar7 = (uv_fs_event_t *)&uStack_3d8;
  puVar6 = &uStack_3d8;
  puVar9 = (uv_fs_event_t *)0x0;
  iVar4 = 0x41;
  puStack_220 = puVar2;
  iVar1 = uv_fs_open((uv_loop_t *)0x0,&uStack_3d8,(char *)puVar8,0x41,0x180,(uv_fs_cb)0x0);
  if (iVar1 < 0) {
    create_file_cold_1();
  }
  else {
    uv_fs_req_cleanup(&uStack_3d8);
    puVar9 = (uv_fs_event_t *)0x0;
    iVar4 = 0;
    iVar1 = uv_fs_close((uv_loop_t *)0x0,&uStack_3d8,iVar1,(uv_fs_cb)0x0);
    puVar7 = (uv_fs_event_t *)puVar6;
    if (iVar1 == 0) {
      uv_fs_req_cleanup(&uStack_3d8);
      return extraout_EAX_02;
    }
  }
  create_file_cold_2();
  fs_event_cb_called = fs_event_cb_called + 1;
  if (puVar9 == &fs_event) {
    if (iVar4 != 0) goto LAB_00156c91;
    if (extraout_EDX_00 != 2) goto LAB_00156c96;
    iVar1 = strcmp((char *)puVar7,"file2");
    if (iVar1 == 0) {
      puVar7 = &fs_event;
      iVar1 = uv_fs_event_stop(&fs_event);
      if (iVar1 == 0) {
        uv_close((uv_handle_t *)&fs_event,close_cb);
        return extraout_EAX_03;
      }
      goto LAB_00156ca0;
    }
  }
  else {
    fs_event_cb_file_cold_1();
LAB_00156c91:
    fs_event_cb_file_cold_2();
LAB_00156c96:
    puVar7 = puVar9;
    fs_event_cb_file_cold_3();
  }
  fs_event_cb_file_cold_4();
LAB_00156ca0:
  fs_event_cb_file_cold_5();
  if (timer_cb_called == 0) {
    timer_cb_called = timer_cb_called + 1;
    touch_file("watch_dir/file1");
    return extraout_EAX_05;
  }
  timer_cb_called = timer_cb_called + 1;
  touch_file("watch_dir/file2");
  uv_close((uv_handle_t *)puVar7,close_cb);
  return extraout_EAX_04;
}

Assistant:

TEST_IMPL(fs_event_watch_dir) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#elif defined(__MVS__)
  RETURN_SKIP("Directory watching not supported on this platform.");
#endif

  uv_loop_t* loop = uv_default_loop();
  int r;

  /* Setup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");
  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event);
  ASSERT(r == 0);
  r = uv_fs_event_start(&fs_event, fs_event_cb_dir_multi_file, "watch_dir", 0);
  ASSERT(r == 0);
  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);
  r = uv_timer_start(&timer, fs_event_create_files, 100, 0);
  ASSERT(r == 0);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT(fs_event_cb_called == fs_event_created + fs_event_removed);
  ASSERT(close_cb_called == 2);

  /* Cleanup */
  fs_event_unlink_files(NULL);
  remove("watch_dir/file2");
  remove("watch_dir/file1");
  remove("watch_dir/");

  MAKE_VALGRIND_HAPPY();
  return 0;
}